

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

int __thiscall nite::Batch::init(Batch *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppBVar1;
  float fVar2;
  iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int in_EAX;
  GLuint GVar4;
  int iVar5;
  long lVar6;
  int in_EDX;
  pointer pBVar7;
  long lVar8;
  Batch *local_80 [2];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer ppBStack_48;
  pointer local_40;
  float local_38;
  float local_34;
  
  local_34 = (float)(int)ctx;
  if (-1 < this->objectId) {
    fVar2 = (this->size).x;
    if ((fVar2 == local_34) && (!NAN(fVar2) && !NAN(local_34))) {
      fVar2 = (this->size).y;
      if ((fVar2 == (float)in_EDX) && (!NAN(fVar2) && !NAN((float)in_EDX))) {
        return in_EAX;
      }
    }
    unload(this);
  }
  lVar8 = ((long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar6 = 0;
    pBVar7 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (pBVar7->empty != false) goto LAB_00179e26;
      lVar6 = lVar6 + 1;
      pBVar7 = pBVar7 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&((BatchT *)local_80)->hash + 0x10);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = (pointer)0x0;
  ppBStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_80[0] = (Batch *)CONCAT71(local_80[0]._1_7_,true);
  local_70._M_p = (pointer)paVar3;
  std::vector<BatchT,_std::allocator<BatchT>_>::emplace_back<BatchT>(&batches,(BatchT *)local_80);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50);
  }
  lVar6 = lVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != paVar3) {
    operator_delete(local_70._M_p);
  }
LAB_00179e26:
  pBVar7 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = (int)lVar6;
  this->objectId = iVar5;
  __position._M_current =
       pBVar7[iVar5].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_80[0] = this;
  if (__position._M_current ==
      pBVar7[iVar5].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<nite::Batch*,std::allocator<nite::Batch*>>::_M_realloc_insert<nite::Batch*>
              ((vector<nite::Batch*,std::allocator<nite::Batch*>> *)&pBVar7[iVar5].owners,__position
               ,(Batch **)local_80);
    iVar5 = this->objectId;
  }
  else {
    *__position._M_current = this;
    pppBVar1 = &pBVar7[iVar5].owners.
                super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar5].empty = false;
  local_38 = (float)in_EDX;
  Vec2::set(&this->size,local_34,local_38);
  Rect::set(&this->region,0.0,0.0,local_34,local_38);
  Vec2::set(&this->scale,1.0,1.0);
  (*__glewGenFramebuffers)
            (1,&batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                super__Vector_impl_data._M_start[this->objectId].framebufferId);
  (*__glewBindFramebuffer)
            (0x8d40,batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                    super__Vector_impl_data._M_start[this->objectId].framebufferId);
  GVar4 = createTexture((int)ctx,in_EDX);
  batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
  _M_start[this->objectId].textureId = GVar4;
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,GVar4,0);
  iVar5 = (*__glewBindFramebuffer)(0x8d40,0);
  return iVar5;
}

Assistant:

void nite::Batch::init(int w, int h){
	if(objectId >= 0){
		if(w == size.x && h == size.y){
			return;
		}
		unload();
	}
	objectId = getEmptySlot();
	batches[objectId].owners.push_back(this);
	batches[objectId].empty = false;
	size.set(w, h);
	region.set(0, 0, w, h);
	scale.set(1.0f, 1.0f);
	glGenFramebuffers(1, &batches[objectId].framebufferId);
	glBindFramebuffer(GL_FRAMEBUFFER, batches[objectId].framebufferId);
	batches[objectId].textureId = createTexture(w, h);
	glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, batches[objectId].textureId, 0);
	glBindFramebuffer(GL_FRAMEBUFFER, 0);
}